

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O0

array_ptr<unsigned_char,_true> __thiscall
duckdb::Node256Leaf::GetBytes(Node256Leaf *this,ArenaAllocator *arena)

{
  TemplatedValidityMask<unsigned_long> *in_RDI;
  uint16_t i;
  uint16_t ptr_idx;
  ValidityMask v_mask;
  data_ptr_t mem;
  array_ptr<unsigned_char,_true> bytes;
  validity_t *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  uchar in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  undefined2 local_4c;
  undefined1 local_10 [16];
  
  ArenaAllocator::AllocateAligned
            ((ArenaAllocator *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
             (idx_t)in_stack_ffffffffffffff88);
  array_ptr<unsigned_char,_true>::array_ptr
            ((array_ptr<unsigned_char,_true> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
             (uchar *)in_stack_ffffffffffffff88,0x18cbf8c);
  ValidityMask::ValidityMask
            ((ValidityMask *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
             in_stack_ffffffffffffff88,0x18cbfa4);
  for (local_4c = 0; local_4c < 0x100; local_4c = local_4c + 1) {
    in_stack_ffffffffffffff97 =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   (in_RDI,CONCAT17(in_stack_ffffffffffffff97,
                                    CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    if ((bool)in_stack_ffffffffffffff97) {
      in_stack_ffffffffffffff96 = UnsafeNumericCast<unsigned_char,unsigned_short,void>(local_4c);
      in_stack_ffffffffffffff88 =
           (validity_t *)
           array_ptr<unsigned_char,_true>::operator[]
                     ((array_ptr<unsigned_char,_true> *)
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                      (idx_t)in_stack_ffffffffffffff88);
      *(uchar *)in_stack_ffffffffffffff88 = in_stack_ffffffffffffff96;
    }
  }
  ValidityMask::~ValidityMask((ValidityMask *)0x18cc058);
  return (array_ptr<unsigned_char,_true>)local_10;
}

Assistant:

array_ptr<uint8_t> Node256Leaf::GetBytes(ArenaAllocator &arena) {
	auto mem = arena.AllocateAligned(sizeof(uint8_t) * count);
	array_ptr<uint8_t> bytes(mem, count);

	ValidityMask v_mask(&mask[0], Node256::CAPACITY);
	uint16_t ptr_idx = 0;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		if (v_mask.RowIsValid(i)) {
			bytes[ptr_idx++] = UnsafeNumericCast<uint8_t>(i);
		}
	}

	return bytes;
}